

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

Value * duckdb::OtherBucketValue(Value *__return_storage_ptr__,LogicalType *type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LogicalTypeId LVar2;
  pointer pcVar3;
  LogicalType *child_type;
  child_list_t<LogicalType> *pcVar4;
  InternalException *this;
  pointer ppVar5;
  child_list_t<Value> child_list;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_148;
  pointer local_130;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  local_128;
  vector<duckdb::Value,_true> local_c8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_a8;
  LogicalType local_88;
  Value local_70;
  
  LVar2 = type->id_;
  switch(LVar2) {
  case TINYINT:
  case SMALLINT:
  case INTEGER:
  case BIGINT:
  case TIME:
  case DECIMAL:
  case UTINYINT:
  case USMALLINT:
  case UINTEGER:
  case UBIGINT:
  case TIME_TZ:
  case UHUGEINT:
  case HUGEINT:
    Value::MaximumValue(__return_storage_ptr__,type);
    break;
  case DATE:
  case TIMESTAMP_SEC:
  case TIMESTAMP_MS:
  case TIMESTAMP:
  case TIMESTAMP_NS:
  case FLOAT:
  case DOUBLE:
  case TIMESTAMP_TZ:
    Value::Infinity(__return_storage_ptr__,type);
    break;
  case CHAR:
  case INTERVAL:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
switchD_01abe62b_caseD_18:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_128.first._M_dataplus._M_p = (pointer)&local_128.first.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,"Unsupported type for other bucket","");
    InternalException::InternalException(this,(string *)&local_128);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case VARCHAR:
    Value::Value(__return_storage_ptr__,anon_var_dwarf_4f001a4 + 9);
    break;
  case BLOB:
    paVar1 = &local_128.first.field_2;
    local_128.first._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_128,anon_var_dwarf_4f001a4 + 9);
    Value::BLOB(__return_storage_ptr__,&local_128.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_128.first._M_dataplus._M_p);
    }
    break;
  default:
    if (LVar2 == STRUCT) {
      pcVar4 = StructType::GetChildTypes_abi_cxx11_(type);
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppVar5 = (pcVar4->
               super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ).
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_130 = (pcVar4->
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar5 != local_130) {
        do {
          LogicalType::LogicalType(&local_88,&ppVar5->second);
          Value::Value(&local_70,&local_88);
          local_128.first._M_dataplus._M_p = (pointer)&local_128.first.field_2;
          pcVar3 = (ppVar5->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar3,pcVar3 + (ppVar5->first)._M_string_length);
          Value::Value(&local_128.second,&local_70);
          ::std::
          vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
          ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
                    ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
                      *)&local_148,&local_128);
          Value::~Value(&local_128.second);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128.first._M_dataplus._M_p != &local_128.first.field_2) {
            operator_delete(local_128.first._M_dataplus._M_p);
          }
          Value::~Value(&local_70);
          LogicalType::~LogicalType(&local_88);
          ppVar5 = ppVar5 + 1;
        } while (ppVar5 != local_130);
      }
      local_a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_148.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_148.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_a8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_148.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::STRUCT(__return_storage_ptr__,(child_list_t<Value> *)&local_a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_a8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
      ::~vector(&local_148);
    }
    else {
      if (LVar2 != LIST) goto switchD_01abe62b_caseD_18;
      child_type = ListType::GetChildType(type);
      local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Value::LIST(__return_storage_ptr__,child_type,&local_c8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Value OtherBucketValue(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::TINYINT:
	case LogicalTypeId::SMALLINT:
	case LogicalTypeId::INTEGER:
	case LogicalTypeId::BIGINT:
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::DECIMAL:
	case LogicalTypeId::UTINYINT:
	case LogicalTypeId::USMALLINT:
	case LogicalTypeId::UINTEGER:
	case LogicalTypeId::UBIGINT:
	case LogicalTypeId::UHUGEINT:
	case LogicalTypeId::TIME:
	case LogicalTypeId::TIME_TZ:
		return Value::MaximumValue(type);
	case LogicalTypeId::DATE:
	case LogicalTypeId::TIMESTAMP:
	case LogicalTypeId::TIMESTAMP_TZ:
	case LogicalTypeId::TIMESTAMP_SEC:
	case LogicalTypeId::TIMESTAMP_MS:
	case LogicalTypeId::TIMESTAMP_NS:
	case LogicalTypeId::FLOAT:
	case LogicalTypeId::DOUBLE:
		return Value::Infinity(type);
	case LogicalTypeId::VARCHAR:
		return Value("");
	case LogicalTypeId::BLOB:
		return Value::BLOB("");
	case LogicalTypeId::STRUCT: {
		// for structs we can set all child members to NULL
		auto &child_types = StructType::GetChildTypes(type);
		child_list_t<Value> child_list;
		for (auto &child_type : child_types) {
			child_list.push_back(make_pair(child_type.first, Value(child_type.second)));
		}
		return Value::STRUCT(std::move(child_list));
	}
	case LogicalTypeId::LIST:
		return Value::LIST(ListType::GetChildType(type), vector<Value>());
	default:
		throw InternalException("Unsupported type for other bucket");
	}
}